

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlSaveWriteAttrContent(xmlSaveCtxt *ctxt,xmlAttrPtr attr)

{
  xmlOutputBufferPtr out;
  xmlOutputBufferPtr buf;
  xmlNodePtr children;
  xmlAttrPtr attr_local;
  xmlSaveCtxt *ctxt_local;
  
  out = ctxt->buf;
  for (buf = (xmlOutputBufferPtr)attr->children; buf != (xmlOutputBufferPtr)0x0;
      buf = *(xmlOutputBufferPtr *)&buf->written) {
    if (*(int *)&buf->writecallback == 3) {
      xmlSaveWriteText(ctxt,(xmlChar *)buf[1].encoder,1);
    }
    else if (*(int *)&buf->writecallback == 5) {
      xmlOutputBufferWrite(out,1,"&");
      xmlOutputBufferWriteString(out,(char *)buf->closecallback);
      xmlOutputBufferWrite(out,1,";");
    }
  }
  return;
}

Assistant:

static void
xmlSaveWriteAttrContent(xmlSaveCtxt *ctxt, xmlAttrPtr attr)
{
    xmlNodePtr children;
    xmlOutputBufferPtr buf = ctxt->buf;

    children = attr->children;
    while (children != NULL) {
        switch (children->type) {
            case XML_TEXT_NODE:
	        xmlSaveWriteText(ctxt, children->content, XML_ESCAPE_ATTR);
		break;
            case XML_ENTITY_REF_NODE:
                xmlOutputBufferWrite(buf, 1, "&");
                xmlOutputBufferWriteString(buf, (const char *) children->name);
                xmlOutputBufferWrite(buf, 1, ";");
                break;
            default:
                /* should not happen unless we have a badly built tree */
                break;
        }
        children = children->next;
    }
}